

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_tls.cc
# Opt level: O0

int aead_tls_seal_scatter
              (EVP_AEAD_CTX *ctx,uint8_t *out,uint8_t *out_tag,size_t *out_tag_len,
              size_t max_out_tag_len,uint8_t *nonce,size_t nonce_len,uint8_t *in,size_t in_len,
              uint8_t *extra_in,size_t extra_in_len,uint8_t *ad,size_t ad_len)

{
  undefined8 uVar1;
  int iVar2;
  uint32_t uVar3;
  uint uVar4;
  size_t sVar5;
  ulong n;
  uchar local_1e8 [4];
  uint padding_len;
  uint8_t padding [256];
  size_t tag_len;
  uchar local_d8 [4];
  int buf_len;
  uint8_t buf [32];
  size_t early_mac_len;
  int local_a0;
  uint block_size;
  int len;
  uint mac_len;
  uint8_t mac [64];
  uchar local_4a;
  undefined1 local_49;
  EVP_CIPHER_CTX *pEStack_48;
  uint8_t ad_extra [2];
  AEAD_TLS_CTX *tls_ctx;
  uint8_t *nonce_local;
  size_t max_out_tag_len_local;
  size_t *out_tag_len_local;
  uint8_t *out_tag_local;
  uint8_t *out_local;
  EVP_AEAD_CTX *ctx_local;
  
  pEStack_48 = (EVP_CIPHER_CTX *)&ctx->state;
  if (*(int *)((long)&ctx->state + 0x1c) == 0) {
    ERR_put_error(0x1e,0,0x70,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/e_tls.cc"
                  ,0x80);
  }
  else if (in_len < 0x80000000) {
    sVar5 = aead_tls_tag_len(ctx,in_len,extra_in_len);
    if (max_out_tag_len < sVar5) {
      ERR_put_error(0x1e,0,0x67,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/e_tls.cc"
                    ,0x8b);
    }
    else {
      sVar5 = EVP_AEAD_nonce_length(ctx->aead);
      if (nonce_len == sVar5) {
        if (ad_len == 0xb) {
          local_4a = (uchar)(in_len >> 8);
          local_49 = (undefined1)in_len;
          iVar2 = HMAC_Init_ex((HMAC_CTX *)(pEStack_48->final + 0x10),(void *)0x0,0,(EVP_MD *)0x0,
                               (ENGINE *)0x0);
          if ((((iVar2 != 0) &&
               (iVar2 = HMAC_Update((HMAC_CTX *)(pEStack_48->final + 0x10),ad,0xb), iVar2 != 0)) &&
              (iVar2 = HMAC_Update((HMAC_CTX *)(pEStack_48->final + 0x10),&local_4a,2), iVar2 != 0))
             && ((iVar2 = HMAC_Update((HMAC_CTX *)(pEStack_48->final + 0x10),in,in_len), iVar2 != 0
                 && (iVar2 = HMAC_Final((HMAC_CTX *)(pEStack_48->final + 0x10),(uchar *)&len,
                                        &block_size), iVar2 != 0)))) {
            uVar3 = EVP_CIPHER_CTX_mode((EVP_CIPHER_CTX *)pEStack_48);
            if ((uVar3 == 2) &&
               ((pEStack_48[1].final[0x11] == '\0' &&
                (iVar2 = EVP_EncryptInit_ex(pEStack_48,(EVP_CIPHER *)0x0,(ENGINE *)0x0,(uchar *)0x0,
                                            nonce), iVar2 == 0)))) {
              return 0;
            }
            iVar2 = EVP_EncryptUpdate(pEStack_48,out,&local_a0,in,(int)in_len);
            if (iVar2 == 0) {
              return 0;
            }
            uVar4 = EVP_CIPHER_CTX_block_size(pEStack_48);
            n = ((ulong)uVar4 - in_len % (ulong)uVar4) % (ulong)uVar4;
            if (n != 0) {
              if ((local_a0 + uVar4) - n != in_len) {
                __assert_fail("len + block_size - early_mac_len == in_len",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/e_tls.cc"
                              ,0xc0,
                              "int aead_tls_seal_scatter(const EVP_AEAD_CTX *, uint8_t *, uint8_t *, size_t *, const size_t, const uint8_t *, const size_t, const uint8_t *, const size_t, const uint8_t *, const size_t, const uint8_t *, const size_t)"
                             );
              }
              iVar2 = EVP_EncryptUpdate(pEStack_48,local_d8,(int *)((long)&tag_len + 4),
                                        (uchar *)&len,(int)n);
              if (iVar2 == 0) {
                return 0;
              }
              if (tag_len._4_4_ != uVar4) {
                __assert_fail("buf_len == (int)block_size",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/e_tls.cc"
                              ,199,
                              "int aead_tls_seal_scatter(const EVP_AEAD_CTX *, uint8_t *, uint8_t *, size_t *, const size_t, const uint8_t *, const size_t, const uint8_t *, const size_t, const uint8_t *, const size_t, const uint8_t *, const size_t)"
                             );
              }
              OPENSSL_memcpy(out + local_a0,local_d8,uVar4 - n);
              OPENSSL_memcpy(out_tag,local_d8 + (uVar4 - n),n);
            }
            padding._248_8_ = n;
            iVar2 = EVP_EncryptUpdate(pEStack_48,out_tag + n,&local_a0,(uchar *)((long)&len + n),
                                      block_size - (int)n);
            if (iVar2 == 0) {
              return 0;
            }
            padding._248_8_ = (long)local_a0 + padding._248_8_;
            if (1 < uVar4) {
              if (0x100 < uVar4) {
                __assert_fail("block_size <= 256",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/e_tls.cc"
                              ,0xd4,
                              "int aead_tls_seal_scatter(const EVP_AEAD_CTX *, uint8_t *, uint8_t *, size_t *, const size_t, const uint8_t *, const size_t, const uint8_t *, const size_t, const uint8_t *, const size_t, const uint8_t *, const size_t)"
                             );
              }
              uVar3 = EVP_CIPHER_CTX_mode((EVP_CIPHER_CTX *)pEStack_48);
              if (uVar3 != 2) {
                __assert_fail("EVP_CIPHER_CTX_mode(&tls_ctx->cipher_ctx) == EVP_CIPH_CBC_MODE",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/e_tls.cc"
                              ,0xd5,
                              "int aead_tls_seal_scatter(const EVP_AEAD_CTX *, uint8_t *, uint8_t *, size_t *, const size_t, const uint8_t *, const size_t, const uint8_t *, const size_t, const uint8_t *, const size_t, const uint8_t *, const size_t)"
                             );
              }
              uVar4 = uVar4 - (int)((in_len + block_size) % (ulong)uVar4);
              OPENSSL_memset(local_1e8,uVar4 - 1,(ulong)uVar4);
              iVar2 = EVP_EncryptUpdate(pEStack_48,out_tag + padding._248_8_,&local_a0,local_1e8,
                                        uVar4);
              if (iVar2 == 0) {
                return 0;
              }
              padding._248_8_ = (long)local_a0 + padding._248_8_;
            }
            iVar2 = EVP_EncryptFinal_ex(pEStack_48,out_tag + padding._248_8_,&local_a0);
            uVar1 = padding._248_8_;
            if (iVar2 == 0) {
              return 0;
            }
            if (local_a0 != 0) {
              __assert_fail("len == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/e_tls.cc"
                            ,0xe5,
                            "int aead_tls_seal_scatter(const EVP_AEAD_CTX *, uint8_t *, uint8_t *, size_t *, const size_t, const uint8_t *, const size_t, const uint8_t *, const size_t, const uint8_t *, const size_t, const uint8_t *, const size_t)"
                           );
            }
            sVar5 = aead_tls_tag_len(ctx,in_len,extra_in_len);
            if (uVar1 != sVar5) {
              __assert_fail("tag_len == aead_tls_tag_len(ctx, in_len, extra_in_len)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/e_tls.cc"
                            ,0xe6,
                            "int aead_tls_seal_scatter(const EVP_AEAD_CTX *, uint8_t *, uint8_t *, size_t *, const size_t, const uint8_t *, const size_t, const uint8_t *, const size_t, const uint8_t *, const size_t, const uint8_t *, const size_t)"
                           );
            }
            *out_tag_len = padding._248_8_;
            return 1;
          }
        }
        else {
          ERR_put_error(0x1e,0,0x6d,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/e_tls.cc"
                        ,0x95);
        }
      }
      else {
        ERR_put_error(0x1e,0,0x6f,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/e_tls.cc"
                      ,0x90);
      }
    }
  }
  else {
    ERR_put_error(0x1e,0,0x75,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/e_tls.cc"
                  ,0x86);
  }
  return 0;
}

Assistant:

static int aead_tls_seal_scatter(const EVP_AEAD_CTX *ctx, uint8_t *out,
                                 uint8_t *out_tag, size_t *out_tag_len,
                                 const size_t max_out_tag_len,
                                 const uint8_t *nonce, const size_t nonce_len,
                                 const uint8_t *in, const size_t in_len,
                                 const uint8_t *extra_in,
                                 const size_t extra_in_len, const uint8_t *ad,
                                 const size_t ad_len) {
  AEAD_TLS_CTX *tls_ctx = (AEAD_TLS_CTX *)&ctx->state;

  if (!tls_ctx->cipher_ctx.encrypt) {
    // Unlike a normal AEAD, a TLS AEAD may only be used in one direction.
    OPENSSL_PUT_ERROR(CIPHER, CIPHER_R_INVALID_OPERATION);
    return 0;
  }

  if (in_len > INT_MAX) {
    // EVP_CIPHER takes int as input.
    OPENSSL_PUT_ERROR(CIPHER, CIPHER_R_TOO_LARGE);
    return 0;
  }

  if (max_out_tag_len < aead_tls_tag_len(ctx, in_len, extra_in_len)) {
    OPENSSL_PUT_ERROR(CIPHER, CIPHER_R_BUFFER_TOO_SMALL);
    return 0;
  }

  if (nonce_len != EVP_AEAD_nonce_length(ctx->aead)) {
    OPENSSL_PUT_ERROR(CIPHER, CIPHER_R_INVALID_NONCE_SIZE);
    return 0;
  }

  if (ad_len != 13 - 2 /* length bytes */) {
    OPENSSL_PUT_ERROR(CIPHER, CIPHER_R_INVALID_AD_SIZE);
    return 0;
  }

  // To allow for CBC mode which changes cipher length, |ad| doesn't include the
  // length for legacy ciphers.
  uint8_t ad_extra[2];
  ad_extra[0] = (uint8_t)(in_len >> 8);
  ad_extra[1] = (uint8_t)(in_len & 0xff);

  // Compute the MAC. This must be first in case the operation is being done
  // in-place.
  uint8_t mac[EVP_MAX_MD_SIZE];
  unsigned mac_len;
  if (!HMAC_Init_ex(&tls_ctx->hmac_ctx, NULL, 0, NULL, NULL) ||
      !HMAC_Update(&tls_ctx->hmac_ctx, ad, ad_len) ||
      !HMAC_Update(&tls_ctx->hmac_ctx, ad_extra, sizeof(ad_extra)) ||
      !HMAC_Update(&tls_ctx->hmac_ctx, in, in_len) ||
      !HMAC_Final(&tls_ctx->hmac_ctx, mac, &mac_len)) {
    return 0;
  }

  // Configure the explicit IV.
  if (EVP_CIPHER_CTX_mode(&tls_ctx->cipher_ctx) == EVP_CIPH_CBC_MODE &&
      !tls_ctx->implicit_iv &&
      !EVP_EncryptInit_ex(&tls_ctx->cipher_ctx, NULL, NULL, NULL, nonce)) {
    return 0;
  }

  // Encrypt the input.
  int len;
  if (!EVP_EncryptUpdate(&tls_ctx->cipher_ctx, out, &len, in, (int)in_len)) {
    return 0;
  }

  unsigned block_size = EVP_CIPHER_CTX_block_size(&tls_ctx->cipher_ctx);

  // Feed the MAC into the cipher in two steps. First complete the final partial
  // block from encrypting the input and split the result between |out| and
  // |out_tag|. Then feed the rest.

  const size_t early_mac_len = (block_size - (in_len % block_size)) % block_size;
  if (early_mac_len != 0) {
    assert(len + block_size - early_mac_len == in_len);
    uint8_t buf[EVP_MAX_BLOCK_LENGTH];
    int buf_len;
    if (!EVP_EncryptUpdate(&tls_ctx->cipher_ctx, buf, &buf_len, mac,
                           (int)early_mac_len)) {
      return 0;
    }
    assert(buf_len == (int)block_size);
    OPENSSL_memcpy(out + len, buf, block_size - early_mac_len);
    OPENSSL_memcpy(out_tag, buf + block_size - early_mac_len, early_mac_len);
  }
  size_t tag_len = early_mac_len;

  if (!EVP_EncryptUpdate(&tls_ctx->cipher_ctx, out_tag + tag_len, &len,
                         mac + tag_len, mac_len - tag_len)) {
    return 0;
  }
  tag_len += len;

  if (block_size > 1) {
    assert(block_size <= 256);
    assert(EVP_CIPHER_CTX_mode(&tls_ctx->cipher_ctx) == EVP_CIPH_CBC_MODE);

    // Compute padding and feed that into the cipher.
    uint8_t padding[256];
    unsigned padding_len = block_size - ((in_len + mac_len) % block_size);
    OPENSSL_memset(padding, padding_len - 1, padding_len);
    if (!EVP_EncryptUpdate(&tls_ctx->cipher_ctx, out_tag + tag_len, &len,
                           padding, (int)padding_len)) {
      return 0;
    }
    tag_len += len;
  }

  if (!EVP_EncryptFinal_ex(&tls_ctx->cipher_ctx, out_tag + tag_len, &len)) {
    return 0;
  }
  assert(len == 0);  // Padding is explicit.
  assert(tag_len == aead_tls_tag_len(ctx, in_len, extra_in_len));

  *out_tag_len = tag_len;
  return 1;
}